

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

PtrTokenOrSyntax * __thiscall
slang::syntax::ModuleHeaderSyntax::getChildPtr
          (PtrTokenOrSyntax *__return_storage_ptr__,ModuleHeaderSyntax *this,size_t index)

{
  __index_type *p_Var1;
  
  switch(this) {
  case (ModuleHeaderSyntax *)0x0:
    p_Var1 = (__index_type *)
             ((long)&__return_storage_ptr__[1].
                     super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
             + 8);
    break;
  case (ModuleHeaderSyntax *)0x1:
    p_Var1 = (__index_type *)
             ((long)&__return_storage_ptr__[2].
                     super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
             + 8);
    break;
  case (ModuleHeaderSyntax *)0x2:
    p_Var1 = (__index_type *)
             ((long)&__return_storage_ptr__[3].
                     super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
             + 8);
    break;
  case (ModuleHeaderSyntax *)0x3:
    return __return_storage_ptr__ + 5;
  case (ModuleHeaderSyntax *)0x4:
    return *(PtrTokenOrSyntax **)
            &__return_storage_ptr__[8].
             super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>;
  case (ModuleHeaderSyntax *)0x5:
    return *(PtrTokenOrSyntax **)
            ((long)&__return_storage_ptr__[8].
                    super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
            + 8);
  case (ModuleHeaderSyntax *)0x6:
    p_Var1 = (__index_type *)(__return_storage_ptr__ + 9);
    break;
  default:
    return (PtrTokenOrSyntax *)0x0;
  }
  return (PtrTokenOrSyntax *)p_Var1;
}

Assistant:

PtrTokenOrSyntax ModuleHeaderSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &moduleKeyword;
        case 1: return &lifetime;
        case 2: return &name;
        case 3: return &imports;
        case 4: return parameters;
        case 5: return ports;
        case 6: return &semi;
        default: return nullptr;
    }
}